

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> * __thiscall
llvm::DWARFUnit::determineStringOffsetsTableContribution
          (Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *__return_storage_ptr__
          ,DWARFUnit *this,DWARFDataExtractor *DA)

{
  unsigned_long *puVar1;
  storage_type *Val;
  unsigned_long Offset;
  Optional<unsigned_long> OVar2;
  DWARFDie local_88;
  undefined1 local_78 [8];
  Expected<llvm::StrOffsetsContributionDescriptor> DescOrError;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_40;
  Optional<unsigned_long> OptOffset;
  
  if (this->IsDWO == true) {
    if ((DA->super_DataExtractor).Data.Data == (char *)0x0) {
LAB_00d9fd72:
      Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>::
      Expected<llvm::NoneType_const&>
                ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>> *)
                 __return_storage_ptr__,&None,(type *)0x0);
      return __return_storage_ptr__;
    }
    Offset = 0;
  }
  else {
    local_88 = getUnitDIE(this,true);
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_78,&local_88,DW_AT_str_offsets_base);
    OVar2 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_78);
    local_40 = OVar2.Storage.field_0;
    OptOffset.Storage.field_0.empty = OVar2.Storage.hasVal;
    if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_00d9fd72;
    puVar1 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_40);
    Offset = *puVar1;
  }
  parseDWARFStringOffsetsTableHeader
            ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_78,DA,
             (this->Header).FormParams.Format,Offset);
  if ((DescOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
    Val = Expected<llvm::StrOffsetsContributionDescriptor>::getStorage
                    ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_78);
    Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>::
    Expected<llvm::StrOffsetsContributionDescriptor&>
              ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>> *)
               __return_storage_ptr__,Val,(type *)0x0);
  }
  else {
    Expected<llvm::StrOffsetsContributionDescriptor>::takeError
              ((Expected<llvm::StrOffsetsContributionDescriptor> *)&OptOffset.Storage.hasVal);
    Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::Expected
              (__return_storage_ptr__,(Error *)&OptOffset.Storage.hasVal);
    if ((long *)(OptOffset.Storage._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(OptOffset.Storage._8_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  Expected<llvm::StrOffsetsContributionDescriptor>::~Expected
            ((Expected<llvm::StrOffsetsContributionDescriptor> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

Expected<Optional<StrOffsetsContributionDescriptor>>
DWARFUnit::determineStringOffsetsTableContribution(DWARFDataExtractor &DA) {
  uint64_t Offset;
  if (IsDWO) {
    Offset = 0;
    if (DA.getData().data() == nullptr)
      return None;
  } else {
    auto OptOffset = toSectionOffset(getUnitDIE().find(DW_AT_str_offsets_base));
    if (!OptOffset)
      return None;
    Offset = *OptOffset;
  }
  auto DescOrError = parseDWARFStringOffsetsTableHeader(DA, Header.getFormat(), Offset);
  if (!DescOrError)
    return DescOrError.takeError();
  return *DescOrError;
}